

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromFile
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,gcstring *FileName)

{
  ExceptionReporter<GenICam_3_4::RuntimeException> *this_00;
  int *pRefCount;
  gcstring *DeviceName;
  INodeMap *pNodeMap_00;
  undefined8 in_RSI;
  long in_RDI;
  INodeMap *pNodeMap;
  CNodeMapFactory nodeMapData;
  char *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  int SourceLine;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this_01;
  char *in_stack_ffffffffffffff08;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> local_d8 [2];
  
  SourceLine = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  if (*(long *)(in_RDI + 8) != 0) {
    local_d8[0]._19_1_ = 1;
    this_00 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (this_00,in_stack_ffffffffffffff08,SourceLine,in_stack_fffffffffffffef8);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (this_00,&local_d8[0].field_0x20,"Node map already created");
    local_d8[0]._19_1_ = 0;
    __cxa_throw(this_00,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::RuntimeException::~RuntimeException);
  }
  this_01 = local_d8;
  GenApi_3_4::CNodeMapFactory::CNodeMapFactory((CNodeMapFactory *)this_01,0,in_RSI,0);
  pRefCount = (int *)GenApi_3_4::CNodeMapFactory::CreateNodeMap
                               ((gcstring *)this_01,(bool)((char)in_RDI + '\x10'));
  DeviceName = (gcstring *)(in_RDI + 0x10);
  pNodeMap_00 = (INodeMap *)operator_new(4);
  *(undefined4 *)pNodeMap_00 = 0;
  Attach(this_01,pNodeMap_00,DeviceName,pRefCount);
  GenApi_3_4::CNodeMapFactory::~CNodeMapFactory((CNodeMapFactory *)local_d8);
  return;
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_LoadXMLFromFile(const GENICAM_NAMESPACE::gcstring &FileName)
    {
        // FileName environment is replaced in CNodeMapFactory ctor

        // Load the DLL
        if(_Ptr)
            throw RUNTIME_EXCEPTION("Node map already created");

        // Load the XML file
        CNodeMapFactory nodeMapData(ContentType_Xml, FileName);

        // First create node map then the reference counter. This prevents a leak in case of bad node map
        INodeMap* pNodeMap = nodeMapData.CreateNodeMap( _DeviceName );
        Attach( pNodeMap, _DeviceName, new int( 0 ) );
    }